

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

void __thiscall
efsw::FileWatcherInotify::handleAction
          (FileWatcherInotify *this,Watcher *watch,string *filename,unsigned_long action,
          string *oldFilename)

{
  WatchID WVar1;
  FileWatchListener *pFVar2;
  Uint64 UVar3;
  bool bVar4;
  undefined1 uVar5;
  __type _Var6;
  ulong uVar7;
  pointer ppVar8;
  _Self local_268;
  _Self local_260;
  iterator it_1;
  string local_250 [32];
  string local_230;
  allocator<char> local_209;
  string local_208 [32];
  _Base_ptr local_1e8;
  FileInfo local_1e0;
  undefined1 local_191;
  FileInfo local_190;
  _Self local_148;
  _Self local_140;
  iterator it;
  string opath;
  string local_f8;
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  string fpath;
  string *oldFilename_local;
  unsigned_long action_local;
  string *filename_local;
  Watcher *watch_local;
  FileWatcherInotify *this_local;
  
  if ((watch != (Watcher *)0x0) && (watch->Listener != (FileWatchListener *)0x0)) {
    fpath.field_2._8_8_ = oldFilename;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &watch->Directory,filename);
    if (((action & 8) == 0) && ((action & 2) == 0)) {
      if ((action & 0x80) == 0) {
        if ((action & 0x100) == 0) {
          if ((action & 0x40) == 0) {
            if ((action & 0x200) != 0) {
              WVar1 = watch->ID;
              pFVar2 = watch->Listener;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (local_250,"",(allocator<char> *)((long)&it_1._M_node + 7));
              (*pFVar2->_vptr_FileWatchListener[2])
                        (pFVar2,WVar1,&watch->Directory,filename,2,local_250);
              std::__cxx11::string::~string(local_250);
              std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_node + 7));
              FileSystem::dirAddSlashAtEnd((string *)local_50);
              if ((watch->Recursive & 1U) != 0) {
                local_260._M_node =
                     (_Base_ptr)
                     std::
                     map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                     ::begin(&this->mWatches);
                while( true ) {
                  local_268._M_node =
                       (_Base_ptr)
                       std::
                       map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                       ::end(&this->mWatches);
                  bVar4 = std::operator!=(&local_260,&local_268);
                  if (!bVar4) break;
                  ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                           operator->(&local_260);
                  _Var6 = std::operator==(&(ppVar8->second->super_Watcher).Directory,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_50);
                  if (_Var6) {
                    ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>
                             ::operator->(&local_260);
                    (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[4])
                              (this,(ppVar8->second->super_Watcher).ID);
                    break;
                  }
                  std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator++
                            (&local_260,0);
                }
              }
            }
          }
          else {
            std::__cxx11::string::operator=((string *)&watch->OldFileName,(string *)filename);
          }
        }
        else {
          WVar1 = watch->ID;
          pFVar2 = watch->Listener;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_208,"",&local_209);
          (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,&watch->Directory,filename,1,local_208)
          ;
          std::__cxx11::string::~string(local_208);
          std::allocator<char>::~allocator(&local_209);
          std::__cxx11::string::string((string *)&local_230,(string *)local_50);
          checkForNewWatcher(this,watch,&local_230);
          std::__cxx11::string::~string((string *)&local_230);
        }
      }
      else {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          WVar1 = watch->ID;
          pFVar2 = watch->Listener;
          std::__cxx11::string::string
                    ((string *)(opath.field_2._M_local_buf + 8),(string *)&watch->OldFileName);
          (*pFVar2->_vptr_FileWatchListener[2])
                    (pFVar2,WVar1,&watch->Directory,filename,4,
                     (undefined1 *)((long)&opath.field_2 + 8));
          std::__cxx11::string::~string((string *)(opath.field_2._M_local_buf + 8));
        }
        else {
          WVar1 = watch->ID;
          pFVar2 = watch->Listener;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_a8,"",&local_a9);
          (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,&watch->Directory,filename,1,local_a8);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator(&local_a9);
          WVar1 = watch->ID;
          pFVar2 = watch->Listener;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_d0,"",&local_d1);
          (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,&watch->Directory,filename,3,local_d0);
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator(&local_d1);
          std::__cxx11::string::string((string *)&local_f8,(string *)local_50);
          checkForNewWatcher(this,watch,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
        if (((watch->Recursive & 1U) != 0) &&
           (bVar4 = FileSystem::isDirectory((string *)local_50), bVar4)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                         &watch->Directory,&watch->OldFileName);
          FileSystem::dirAddSlashAtEnd((string *)&it);
          FileSystem::dirAddSlashAtEnd((string *)local_50);
          local_140._M_node =
               (_Base_ptr)
               std::
               map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
               ::begin(&this->mWatches);
          while( true ) {
            local_148._M_node =
                 (_Base_ptr)
                 std::
                 map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                 ::end(&this->mWatches);
            bVar4 = std::operator!=(&local_140,&local_148);
            if (!bVar4) break;
            ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                     operator->(&local_140);
            uVar5 = std::operator==(&(ppVar8->second->super_Watcher).Directory,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&it);
            local_191 = 0;
            bVar4 = false;
            if ((bool)uVar5) {
              ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                       operator->(&local_140);
              UVar3 = (ppVar8->second->DirInfo).Inode;
              FileInfo::FileInfo(&local_190,(string *)&it);
              bVar4 = UVar3 == local_190.Inode;
              local_191 = uVar5;
              FileInfo::~FileInfo(&local_190);
              uVar5 = local_191;
            }
            local_191 = uVar5;
            if (bVar4) {
              ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                       operator->(&local_140);
              std::__cxx11::string::operator=
                        ((string *)&(ppVar8->second->super_Watcher).Directory,(string *)local_50);
              FileInfo::FileInfo(&local_1e0,(string *)local_50);
              ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                       operator->(&local_140);
              FileInfo::operator=(&ppVar8->second->DirInfo,&local_1e0);
              FileInfo::~FileInfo(&local_1e0);
              break;
            }
            local_1e8 = (_Base_ptr)
                        std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                        operator++(&local_140,0);
          }
          std::__cxx11::string::~string((string *)&it);
        }
        std::__cxx11::string::operator=((string *)&watch->OldFileName,"");
      }
    }
    else {
      WVar1 = watch->ID;
      pFVar2 = watch->Listener;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_70,"",&local_71);
      (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,&watch->Directory,filename,3,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void FileWatcherInotify::handleAction( Watcher* watch, const std::string& filename, unsigned long action, std::string oldFilename )
{
	if ( !watch || !watch->Listener )
	{
		return;
	}

	std::string fpath( watch->Directory + filename );

	if ( ( IN_CLOSE_WRITE & action ) || ( IN_MODIFY & action ) )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Modified );
	}
	else if( IN_MOVED_TO & action )
	{
		/// If OldFileName doesn't exist means that the file has been moved from other folder, so we just send the Add event
		if ( watch->OldFileName.empty() )
		{
			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Add );

			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Modified );

			checkForNewWatcher( watch, fpath );
		}
		else
		{
			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Moved, watch->OldFileName );
		}

		if ( watch->Recursive && FileSystem::isDirectory( fpath ) )
		{
			/// Update the new directory path
			std::string opath( watch->Directory + watch->OldFileName );
			FileSystem::dirAddSlashAtEnd( opath );
			FileSystem::dirAddSlashAtEnd( fpath );

			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); it++ )
			{
				if ( it->second->Directory == opath && it->second->DirInfo.Inode == FileInfo( opath ).Inode )
				{
					it->second->Directory	= fpath;
					it->second->DirInfo		= FileInfo( fpath );

					break;
				}
			}
		}

		watch->OldFileName = "";
	}
	else if( IN_CREATE & action )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Add );

		checkForNewWatcher( watch, fpath );
	}
	else if ( IN_MOVED_FROM & action )
	{
		watch->OldFileName = filename;
	}
	else if( IN_DELETE & action )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Delete );

		FileSystem::dirAddSlashAtEnd( fpath );

		/// If the file erased is a directory and recursive is enabled, removes the directory erased
		if ( watch->Recursive )
		{
			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); it++ )
			{
				if ( it->second->Directory == fpath )
				{
					removeWatch( it->second->ID );
					break;
				}
			}
		}
	}
}